

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

void __thiscall Fossilize::ExternalReplayer::Impl::reset_pid(Impl *this)

{
  this->pid = -1;
  if (-1 < this->kill_fd) {
    close(this->kill_fd);
  }
  this->kill_fd = -1;
  if (-1 < this->control_fd) {
    close(this->control_fd);
  }
  this->control_fd = -1;
  if (-1 < this->child_fd) {
    close(this->child_fd);
  }
  this->child_fd = -1;
  return;
}

Assistant:

void ExternalReplayer::Impl::reset_pid()
{
	pid = -1;
	if (kill_fd >= 0)
		close(kill_fd);
	kill_fd = -1;
	if (control_fd >= 0)
		close(control_fd);
	control_fd = -1;
	if (child_fd >= 0)
		close(child_fd);
	child_fd = -1;
}